

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins.cpp
# Opt level: O2

COutPoint *
AddTestCoin(COutPoint *__return_storage_ptr__,FastRandomContext *rng,CCoinsViewCache *coins_view)

{
  CScript *this;
  long lVar1;
  long in_FS_OFFSET;
  uchar local_59;
  Coin new_coin;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  Coin::Coin(&new_coin);
  RandomMixin<FastRandomContext>::rand256
            ((uint256 *)__return_storage_ptr__,&rng->super_RandomMixin<FastRandomContext>);
  __return_storage_ptr__->n = 0;
  new_coin._40_4_ = new_coin._40_4_ & 1 | 2;
  new_coin.out.nValue = RandMoney<FastRandomContext_&>(rng);
  this = &new_coin.out.scriptPubKey;
  local_59 = '\x01';
  prevector<28U,_unsigned_char,_unsigned_int,_int>::assign(&this->super_CScriptBase,0x38,&local_59);
  CCoinsViewCache::AddCoin(coins_view,__return_storage_ptr__,&new_coin,false);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&this->super_CScriptBase);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

COutPoint AddTestCoin(FastRandomContext& rng, CCoinsViewCache& coins_view)
{
    Coin new_coin;
    COutPoint outpoint{Txid::FromUint256(rng.rand256()), /*nIn=*/0};
    new_coin.nHeight = 1;
    new_coin.out.nValue = RandMoney(rng);
    new_coin.out.scriptPubKey.assign(uint32_t{56}, 1);
    coins_view.AddCoin(outpoint, std::move(new_coin), /*possible_overwrite=*/false);

    return outpoint;
}